

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicInputIBase::Run(BasicInputIBase *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  GLuint GVar11;
  size_type size;
  reference data;
  uint *puVar12;
  int *piVar13;
  Vector<unsigned_int,_4> *local_578;
  uint *local_560;
  Vector<unsigned_int,_4> local_52c;
  Vector<unsigned_int,_4> local_51c;
  Vector<int,_4> local_50c;
  Vector<int,_4> local_4fc;
  int local_4ec;
  undefined1 local_4e8 [4];
  int i;
  UVec4 dataui [32];
  IVec4 datai [32];
  allocator<unsigned_char> local_d1;
  undefined1 local_d0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> zero;
  GLchar *v [16];
  char *pcStack_28;
  GLuint sh;
  char *glsl_vs;
  BasicInputIBase *this_local;
  
  pcStack_28 = 
  "#version 430 core\nlayout(location = 0) in ivec4 vs_in_attribi[8];\nlayout(location = 8) in uvec4 vs_in_attribui[8];\nout StageData {\n  ivec4 attribi[8];\n  uvec4 attribui[8];\n} vs_out;\nvoid main() {\n  for (int i = 0; i < vs_in_attribi.length(); ++i) {\n    vs_out.attribi[i] = vs_in_attribi[i];\n  }\n  for (int i = 0; i < vs_in_attribui.length(); ++i) {\n    vs_out.attribui[i] = vs_in_attribui[i];\n  }\n}"
  ;
  glsl_vs = (char *)this;
  GVar11 = glu::CallLogWrapper::glCreateProgram
                     (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                       super_CallLogWrapper);
  this->m_po = GVar11;
  GVar11 = glu::CallLogWrapper::glCreateShader
                     (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                       super_CallLogWrapper,0x8b31);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar11,1,&stack0xffffffffffffffd8,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar11);
  glu::CallLogWrapper::glAttachShader
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_po,GVar11);
  glu::CallLogWrapper::glDeleteShader
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar11);
  memcpy(&zero.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,&PTR_anon_var_dwarf_2b4366_03238710,0x80);
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_po,0x10,
             (GLchar **)
             &zero.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0x8c8c);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_po);
  bVar10 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_po);
  if (bVar10) {
    std::allocator<unsigned_char>::allocator(&local_d1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,0x400,&local_d1);
    std::allocator<unsigned_char>::~allocator(&local_d1);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0,this->m_xfbo);
    size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
    data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,size,data,0x88ea);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
    glu::CallLogWrapper::glEnable
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c89);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_po);
    glu::CallLogWrapper::glBeginTransformFeedback
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    glu::CallLogWrapper::glDrawArraysInstancedBaseInstance
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0,2,this->instance_count,this->base_instance);
    glu::CallLogWrapper::glEndTransformFeedback
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper);
    local_560 = dataui[0x1f].m_data + 2;
    do {
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_560);
      local_560 = local_560 + 4;
    } while (local_560 != (uint *)(datai[0x1f].m_data + 2));
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0,0x80,dataui[0x1f].m_data + 2);
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0x100,0x80,datai[7].m_data + 2);
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0x200,0x80,datai[0xf].m_data + 2);
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0x300,0x80,datai[0x17].m_data + 2);
    local_578 = (Vector<unsigned_int,_4> *)local_4e8;
    do {
      tcu::Vector<unsigned_int,_4>::Vector(local_578);
      local_578 = local_578 + 1;
    } while (local_578 != (Vector<unsigned_int,_4> *)(dataui[0x1f].m_data + 2));
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0x80,0x80,local_4e8);
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0x180,0x80,dataui[7].m_data + 2);
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0x280,0x80,dataui[0xf].m_data + 2);
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0x380,0x80,dataui[0x17].m_data + 2);
    for (local_4ec = 0; local_4ec < 0x20; local_4ec = local_4ec + 1) {
      tcu::Vector<int,_4>::Vector(&local_4fc,this->expected_datai + local_4ec);
      tcu::Vector<int,_4>::Vector
                (&local_50c,(Vector<int,_4> *)(dataui[(long)local_4ec + 0x1f].m_data + 2));
      bVar10 = VertexAttribBindingBase::IsEqual
                         (&this->super_VertexAttribBindingBase,&local_4fc,&local_50c);
      if (!bVar10) {
        puVar12 = (uint *)tcu::Vector<int,_4>::operator[]
                                    ((Vector<int,_4> *)(dataui[(long)local_4ec + 0x1f].m_data + 2),0
                                    );
        uVar1 = *puVar12;
        puVar12 = (uint *)tcu::Vector<int,_4>::operator[]
                                    ((Vector<int,_4> *)(dataui[(long)local_4ec + 0x1f].m_data + 2),1
                                    );
        uVar2 = *puVar12;
        puVar12 = (uint *)tcu::Vector<int,_4>::operator[]
                                    ((Vector<int,_4> *)(dataui[(long)local_4ec + 0x1f].m_data + 2),2
                                    );
        uVar3 = *puVar12;
        puVar12 = (uint *)tcu::Vector<int,_4>::operator[]
                                    ((Vector<int,_4> *)(dataui[(long)local_4ec + 0x1f].m_data + 2),3
                                    );
        uVar4 = *puVar12;
        puVar12 = (uint *)tcu::Vector<int,_4>::operator[](this->expected_datai + local_4ec,0);
        uVar5 = *puVar12;
        piVar13 = tcu::Vector<int,_4>::operator[](this->expected_datai + local_4ec,1);
        iVar6 = *piVar13;
        piVar13 = tcu::Vector<int,_4>::operator[](this->expected_datai + local_4ec,2);
        iVar7 = *piVar13;
        piVar13 = tcu::Vector<int,_4>::operator[](this->expected_datai + local_4ec,3);
        anon_unknown_0::Output
                  ("Datai is: %d %d %d %d, datai should be: %d %d %d %d, index is: %d.\n",
                   (ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,iVar6,iVar7,
                   *piVar13,local_4ec);
        return (long)&DAT_ffffffffffffffff;
      }
      tcu::Vector<unsigned_int,_4>::Vector(&local_51c,this->expected_dataui + local_4ec);
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_52c,(Vector<unsigned_int,_4> *)(local_4e8 + (long)local_4ec * 0x10));
      bVar10 = VertexAttribBindingBase::IsEqual
                         (&this->super_VertexAttribBindingBase,&local_51c,&local_52c);
      if (!bVar10) {
        puVar12 = tcu::Vector<unsigned_int,_4>::operator[]
                            ((Vector<unsigned_int,_4> *)(local_4e8 + (long)local_4ec * 0x10),0);
        uVar1 = *puVar12;
        puVar12 = tcu::Vector<unsigned_int,_4>::operator[]
                            ((Vector<unsigned_int,_4> *)(local_4e8 + (long)local_4ec * 0x10),1);
        uVar2 = *puVar12;
        puVar12 = tcu::Vector<unsigned_int,_4>::operator[]
                            ((Vector<unsigned_int,_4> *)(local_4e8 + (long)local_4ec * 0x10),2);
        uVar3 = *puVar12;
        puVar12 = tcu::Vector<unsigned_int,_4>::operator[]
                            ((Vector<unsigned_int,_4> *)(local_4e8 + (long)local_4ec * 0x10),3);
        uVar4 = *puVar12;
        puVar12 = tcu::Vector<unsigned_int,_4>::operator[](this->expected_dataui + local_4ec,0);
        uVar5 = *puVar12;
        puVar12 = tcu::Vector<unsigned_int,_4>::operator[](this->expected_dataui + local_4ec,1);
        uVar8 = *puVar12;
        puVar12 = tcu::Vector<unsigned_int,_4>::operator[](this->expected_dataui + local_4ec,2);
        uVar9 = *puVar12;
        puVar12 = tcu::Vector<unsigned_int,_4>::operator[](this->expected_dataui + local_4ec,3);
        anon_unknown_0::Output
                  ("Dataui is: %u %u %u %u, dataui should be: %u %u %u %u, index is: %d.\n",
                   (ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,uVar8,uVar9,
                   *puVar12,local_4ec);
        return (long)&DAT_ffffffffffffffff;
      }
    }
    this_local = (BasicInputIBase *)0x0;
  }
  else {
    this_local = (BasicInputIBase *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs =
			"#version 430 core" NL "layout(location = 0) in ivec4 vs_in_attribi[8];" NL
			"layout(location = 8) in uvec4 vs_in_attribui[8];" NL "out StageData {" NL "  ivec4 attribi[8];" NL
			"  uvec4 attribui[8];" NL "} vs_out;" NL "void main() {" NL
			"  for (int i = 0; i < vs_in_attribi.length(); ++i) {" NL "    vs_out.attribi[i] = vs_in_attribi[i];" NL
			"  }" NL "  for (int i = 0; i < vs_in_attribui.length(); ++i) {" NL
			"    vs_out.attribui[i] = vs_in_attribui[i];" NL "  }" NL "}";
		m_po = glCreateProgram();
		{
			const GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glShaderSource(sh, 1, &glsl_vs, NULL);
			glCompileShader(sh);
			glAttachShader(m_po, sh);
			glDeleteShader(sh);
		}
		{
			const GLchar* const v[16] = { "StageData.attribi[0]",  "StageData.attribi[1]",  "StageData.attribi[2]",
										  "StageData.attribi[3]",  "StageData.attribi[4]",  "StageData.attribi[5]",
										  "StageData.attribi[6]",  "StageData.attribi[7]",  "StageData.attribui[0]",
										  "StageData.attribui[1]", "StageData.attribui[2]", "StageData.attribui[3]",
										  "StageData.attribui[4]", "StageData.attribui[5]", "StageData.attribui[6]",
										  "StageData.attribui[7]" };
			glTransformFeedbackVaryings(m_po, 16, v, GL_INTERLEAVED_ATTRIBS);
		}
		glLinkProgram(m_po);
		if (!CheckProgram(m_po))
			return ERROR;

		{
			std::vector<GLubyte> zero(64 * 16);
			glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_xfbo);
			glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, (GLsizeiptr)zero.size(), &zero[0], GL_DYNAMIC_COPY);
		}

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_po);
		glBeginTransformFeedback(GL_POINTS);
		glDrawArraysInstancedBaseInstance(GL_POINTS, 0, 2, instance_count, base_instance);
		glEndTransformFeedback();

		IVec4 datai[32];
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0 * 16 * 8, 16 * 8, &datai[0]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 2 * 16 * 8, 16 * 8, &datai[8]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 4 * 16 * 8, 16 * 8, &datai[16]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 6 * 16 * 8, 16 * 8, &datai[24]);
		UVec4 dataui[32];
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 1 * 16 * 8, 16 * 8, &dataui[0]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 3 * 16 * 8, 16 * 8, &dataui[8]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 5 * 16 * 8, 16 * 8, &dataui[16]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 7 * 16 * 8, 16 * 8, &dataui[24]);

		for (int i = 0; i < 32; ++i)
		{
			if (!IsEqual(expected_datai[i], datai[i]))
			{
				Output("Datai is: %d %d %d %d, datai should be: %d %d %d %d, index is: %d.\n", datai[i][0], datai[i][1],
					   datai[i][2], datai[i][3], expected_datai[i][0], expected_datai[i][1], expected_datai[i][2],
					   expected_datai[i][3], i);
				return ERROR;
			}
			if (!IsEqual(expected_dataui[i], dataui[i]))
			{
				Output("Dataui is: %u %u %u %u, dataui should be: %u %u %u %u, index is: %d.\n", dataui[i][0],
					   dataui[i][1], dataui[i][2], dataui[i][3], expected_dataui[i][0], expected_dataui[i][1],
					   expected_dataui[i][2], expected_dataui[i][3], i);
				return ERROR;
			}
		}
		return NO_ERROR;
	}